

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

string * safeGetline(string *prompt)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  char *pcVar4;
  string *in_RDI;
  bool bVar5;
  string *s;
  string local_38 [16];
  string *in_stack_ffffffffffffffd8;
  
  std::__cxx11::string::string(in_RDI);
  while (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) != 0) {
    _readline(in_stack_ffffffffffffffd8);
    std::__cxx11::string::operator=(in_RDI,local_38);
    std::__cxx11::string::~string(local_38);
    while( true ) {
      lVar3 = std::__cxx11::string::size();
      bVar5 = false;
      if (lVar3 != 0) {
        pcVar4 = (char *)std::__cxx11::string::back();
        iVar1 = isspace((int)*pcVar4);
        bVar5 = iVar1 != 0;
      }
      if (!bVar5) break;
      std::__cxx11::string::pop_back();
    }
  }
  return in_RDI;
}

Assistant:

string safeGetline(const string &prompt = "")
{
    string s;
    while(s.empty())
    {
        s = _readline(prompt);
        while(s.size() && isspace(s.back()))
            s.pop_back();
    }
    return s;
}